

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Apu.cpp
# Opt level: O0

void __thiscall Sap_Apu::calc_periods(Sap_Apu *this)

{
  int iVar1;
  uint uVar2;
  osc_t *poVar3;
  blargg_long period;
  int osc_reload;
  osc_t *osc;
  int i;
  int divider;
  Sap_Apu *this_local;
  
  divider = 0x1c;
  if ((this->control & 1U) != 0) {
    divider = 0x72;
  }
  for (i = 0; i < 4; i = i + 1) {
    poVar3 = this->oscs + i;
    uVar2 = (uint)poVar3->regs[0];
    period = (uVar2 + 1) * divider;
    if (((this->control & (uint)"@\x10 \b"[i]) != 0) && (period = uVar2 + 4, (i & 1U) != 0)) {
      iVar1 = uVar2 * 0x100 + (uint)poVar3[-1].regs[0];
      period = iVar1 + 7;
      if ((this->control & (uint)"@\x10 \b"[i + -1]) == 0) {
        period = (iVar1 + 1) * divider;
      }
    }
    poVar3->period = period;
  }
  return;
}

Assistant:

inline void Sap_Apu::calc_periods()
{
	 // 15/64 kHz clock
	int divider = 28;
	if ( this->control & 1 )
		divider = 114;
	
	for ( int i = 0; i < osc_count; i++ )
	{
		osc_t* const osc = &oscs [i];
		
		int const osc_reload = osc->regs [0]; // cache
		blargg_long period = (osc_reload + 1) * divider;
		static byte const fast_bits [osc_count] = { 1 << 6, 1 << 4, 1 << 5, 1 << 3 };
		if ( this->control & fast_bits [i] )
		{
			period = osc_reload + 4;
			if ( i & 1 )
			{
				period = osc_reload * 0x100L + osc [-1].regs [0] + 7;
				if ( !(this->control & fast_bits [i - 1]) )
					period = (period - 6) * divider;
				
				if ( (osc [-1].regs [1] & 0x1F) > 0x10 )
					debug_printf( "Use of slave channel in 16-bit mode not supported\n" );
			}
		}
		osc->period = period;
	}
}